

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_combo_begin_symbol(nk_context *ctx,nk_symbol_type symbol,nk_vec2 size)

{
  nk_vec2 nVar1;
  nk_window *win;
  nk_rect r;
  nk_rect header_00;
  nk_widget_layout_states nVar2;
  nk_bool nVar3;
  nk_color *pnVar4;
  long lVar5;
  nk_color c;
  nk_context *i;
  nk_style_combo *pnVar6;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect content;
  nk_rect header;
  nk_rect local_a0;
  nk_color local_90;
  uint local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  nk_rect local_78;
  undefined1 local_68 [16];
  nk_rect local_58;
  nk_rect local_48;
  
  if (((ctx != (nk_context *)0x0) && (win = ctx->current, win != (nk_window *)0x0)) &&
     (win->layout != (nk_panel *)0x0)) {
    local_68._8_4_ = in_XMM0_Dc;
    local_68._0_8_ = size;
    local_68._12_4_ = in_XMM0_Dd;
    nVar2 = nk_widget(&local_a0,ctx);
    if (nVar2 != NK_WIDGET_INVALID) {
      i = ctx;
      if ((win->layout->flags & 0x1000) != 0) {
        i = (nk_context *)0x0;
      }
      if (nVar2 == NK_WIDGET_ROM) {
        i = (nk_context *)0x0;
      }
      local_88 = CONCAT44(local_a0.h,local_a0.w);
      r.w = local_a0.w;
      r.x = local_a0.x;
      r.y = local_a0.y;
      r.h = local_a0.h;
      local_78.x = local_a0.x;
      local_78.y = local_a0.y;
      local_78.w = 0.0;
      local_78.h = 0.0;
      uStack_80 = 0;
      nVar3 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      if ((ctx->last_widget_state & 0x20) == 0) {
        pnVar4 = &(ctx->style).combo.symbol_hover;
        if ((ctx->last_widget_state & 0x10) == 0) {
          pnVar6 = &(ctx->style).combo;
        }
        else {
          pnVar6 = (nk_style_combo *)&(ctx->style).combo.hover;
        }
      }
      else {
        pnVar6 = (nk_style_combo *)&(ctx->style).combo.active;
        pnVar4 = &(ctx->style).combo.symbol_active;
      }
      local_8c = (uint)(nVar3 != 0);
      local_90 = *pnVar4;
      if ((pnVar6->normal).type == NK_STYLE_ITEM_IMAGE) {
        r_00.w = (float)(nk_symbol_type)local_88;
        r_00.h = (float)local_88._4_4_;
        r_00.x = local_78.x;
        r_00.y = local_78.y;
        nk_draw_image(&win->buffer,r_00,&(pnVar6->normal).data.image,(nk_color)0xffffffff);
        c.r = '\0';
        c.g = '\0';
        c.b = '\0';
        c.a = '\0';
      }
      else {
        c = (pnVar6->normal).data.color;
        rect.w = (float)(nk_symbol_type)local_88;
        rect.h = (float)local_88._4_4_;
        rect.x = local_78.x;
        rect.y = local_78.y;
        nk_fill_rect(&win->buffer,rect,(ctx->style).combo.rounding,c);
        rect_00.w = (float)(nk_symbol_type)local_88;
        rect_00.h = (float)local_88._4_4_;
        rect_00.x = local_78.x;
        rect_00.y = local_78.y;
        nk_stroke_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,(ctx->style).combo.border,
                       (ctx->style).combo.border_color);
      }
      lVar5 = 0x1be4;
      if ((ctx->last_widget_state & 0x10) == 0) {
        lVar5 = (ulong)(nVar3 != 0) * 8 + 0x1be0;
      }
      local_88 = CONCAT44(local_88._4_4_,
                          *(undefined4 *)((long)&(ctx->input).keyboard.keys[0].down + lVar5));
      fVar10 = (ctx->style).combo.button_padding.y;
      fVar7 = ((local_a0.w + local_a0.x) - local_a0.h) - fVar10;
      local_58.h = local_a0.h - (fVar10 + fVar10);
      nVar1 = (ctx->style).combo.button.padding;
      fVar8 = nVar1.x;
      local_58.x = fVar7 + fVar8;
      fVar9 = nVar1.y;
      local_58.y = local_a0.y + fVar10 + fVar9;
      local_58.w = local_58.h - (fVar8 + fVar8);
      local_58.h = local_58.h - (fVar9 + fVar9);
      nVar1 = (ctx->style).combo.content_padding;
      content.x = local_a0.x + nVar1.x;
      fVar10 = nVar1.y;
      content.y = local_a0.y + fVar10;
      local_48.h = local_a0.h - (fVar10 + fVar10);
      local_48.y = content.y;
      local_48.x = content.x;
      local_48.w = (fVar7 - fVar10) - content.x;
      content.w = local_48.w;
      content.h = local_48.h;
      nk_draw_symbol(&win->buffer,symbol,content,c,local_90,1.0,(ctx->style).font);
      nk_draw_button_symbol
                (&win->buffer,&local_48,&local_58,ctx->last_widget_state,&(ctx->style).combo.button,
                 (nk_symbol_type)local_88,(ctx->style).font);
      header_00.w = local_a0.w;
      header_00.x = local_a0.x;
      header_00.y = local_a0.y;
      header_00.h = local_a0.h;
      nVar3 = nk_combo_begin(ctx,win,(nk_vec2)local_68._0_8_,local_8c,header_00);
      return nVar3;
    }
  }
  return 0;
}

Assistant:

NK_API nk_bool
nk_combo_begin_symbol(struct nk_context *ctx, enum nk_symbol_type symbol, struct nk_vec2 size)
{
struct nk_window *win;
struct nk_style *style;
const struct nk_input *in;

struct nk_rect header;
int is_clicked = nk_false;
enum nk_widget_layout_states s;
const struct nk_style_item *background;
struct nk_color sym_background;
struct nk_color symbol_color;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
style = &ctx->style;
s = nk_widget(&header, ctx);
if (s == NK_WIDGET_INVALID)
return 0;

in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
is_clicked = nk_true;

/* draw combo box header background and border */
if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
background = &style->combo.active;
symbol_color = style->combo.symbol_active;
} else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
background = &style->combo.hover;
symbol_color = style->combo.symbol_hover;
} else {
background = &style->combo.normal;
symbol_color = style->combo.symbol_hover;
}

if (background->type == NK_STYLE_ITEM_IMAGE) {
sym_background = nk_rgba(0,0,0,0);
nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
} else {
sym_background = background->data.color;
nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
}
{
struct nk_rect bounds = {0,0,0,0};
struct nk_rect content;
struct nk_rect button;

enum nk_symbol_type sym;
if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
sym = style->combo.sym_hover;
else if (is_clicked)
sym = style->combo.sym_active;
else sym = style->combo.sym_normal;

/* calculate button */
button.w = header.h - 2 * style->combo.button_padding.y;
button.x = (header.x + header.w - header.h) - style->combo.button_padding.y;
button.y = header.y + style->combo.button_padding.y;
button.h = button.w;

content.x = button.x + style->combo.button.padding.x;
content.y = button.y + style->combo.button.padding.y;
content.w = button.w - 2 * style->combo.button.padding.x;
content.h = button.h - 2 * style->combo.button.padding.y;

/* draw symbol */
bounds.h = header.h - 2 * style->combo.content_padding.y;
bounds.y = header.y + style->combo.content_padding.y;
bounds.x = header.x + style->combo.content_padding.x;
bounds.w = (button.x - style->combo.content_padding.y) - bounds.x;
nk_draw_symbol(&win->buffer, symbol, bounds, sym_background, symbol_color,
1.0f, style->font);

/* draw open/close button */
nk_draw_button_symbol(&win->buffer, &bounds, &content, ctx->last_widget_state,
&ctx->style.combo.button, sym, style->font);
}
return nk_combo_begin(ctx, win, size, is_clicked, header);
}